

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicCopyTexImage2DCase::createTexture(BasicCopyTexImage2DCase *this)

{
  ContextWrapper *this_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  TextureFormat TVar6;
  Context *pCVar7;
  NotSupportedError *this_01;
  int width;
  int height;
  int ndx;
  deUint32 tex;
  int local_1c0;
  uint local_1bc;
  Random rnd;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  GradientShader shader;
  long lVar5;
  
  iVar1 = (*((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  local_1bc = 0;
  if ((0 < *(int *)(lVar5 + 8)) && (0 < *(int *)(lVar5 + 0xc))) {
    local_1bc = (uint)(0 < *(int *)(lVar5 + 0x10));
  }
  local_1c0 = *(int *)(lVar5 + 0x14);
  TVar6 = mapGLUnsizedInternalFormat(*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4);
  tex = 0;
  dVar2 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar2 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&shader);
  if ((TVar6.order == A || (local_1bc & 1) != 0) &&
     ((RGBA < TVar6.order || (0xedU >> ((byte)TVar6.order & 0x1f) & 1) != 0) || 0 < local_1c0)) {
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    tcu::Vector<float,_4>::Vector(&local_198,0.0);
    tcu::Vector<float,_4>::Vector(&local_1a8,1.0);
    FboTestUtil::GradientShader::setGradient(&shader,pCVar7,dVar2,&local_198,&local_1a8);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_198.m_data[0] = -1.0;
    local_198.m_data[1] = -1.0;
    local_198.m_data[2] = 0.0;
    local_1a8.m_data[0] = 1.0;
    local_1a8.m_data[1] = 1.0;
    local_1a8.m_data[2] = 0.0;
    sglr::drawQuad(pCVar7,dVar2,(Vec3 *)&local_198,(Vec3 *)&local_1a8);
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
    for (iVar1 = 0; iVar1 < (this->super_Texture2DSpecCase).m_numLevels; iVar1 = iVar1 + 1) {
      width = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar1 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar1 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      iVar3 = sglr::ContextWrapper::getWidth(this_00);
      iVar3 = de::Random::getInt(&rnd,0,iVar3 - width);
      iVar4 = sglr::ContextWrapper::getHeight(this_00);
      iVar4 = de::Random::getInt(&rnd,0,iVar4 - height);
      sglr::ContextWrapper::glCopyTexImage2D
                (this_00,0xde1,iVar1,*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4,iVar3,
                 iVar4,width,height,0);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x75f);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= mapGLUnsizedInternalFormat(m_internalFormat);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		x			= rnd.getInt(0, getWidth()	- levelW);
			int		y			= rnd.getInt(0, getHeight()	- levelH);

			glCopyTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, x, y, levelW, levelH, 0);
		}
	}